

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Add_Module(FT_Library library,FT_Module_Class *clazz)

{
  uint uVar1;
  FT_Memory memory_00;
  int iVar2;
  FT_Module pFVar3;
  FT_Renderer_conflict renderer;
  FT_Driver driver;
  FT_UInt nn;
  FT_Module module;
  FT_Memory memory;
  FT_Module_Class *pFStack_20;
  FT_Error error;
  FT_Module_Class *clazz_local;
  FT_Library library_local;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (clazz == (FT_Module_Class *)0x0) {
    return 6;
  }
  if (0x20009 < clazz->module_requires) {
    return 4;
  }
  driver._4_4_ = 0;
  pFStack_20 = clazz;
  clazz_local = (FT_Module_Class *)library;
  do {
    if (*(uint *)((long)&clazz_local->module_name + 4) <= driver._4_4_) {
LAB_00146c65:
      memory_00 = (FT_Memory)clazz_local->module_flags;
      memory._4_4_ = 0;
      if (*(uint *)((long)&clazz_local->module_name + 4) < 0x20) {
        pFVar3 = (FT_Module)
                 ft_mem_alloc(memory_00,pFStack_20->module_size,(FT_Error *)((long)&memory + 4));
        if (memory._4_4_ == 0) {
          pFVar3->library = (FT_Library)clazz_local;
          pFVar3->memory = memory_00;
          pFVar3->clazz = pFStack_20;
          if (((pFVar3->clazz->module_flags & 2) == 0) ||
             (memory._4_4_ = ft_add_renderer(pFVar3), memory._4_4_ == 0)) {
            if ((pFVar3->clazz->module_flags & 4) != 0) {
              clazz_local[4].module_name = (FT_String *)pFVar3;
            }
            if ((pFVar3->clazz->module_flags & 1) != 0) {
              pFVar3[1].clazz = pFVar3->clazz;
            }
            if ((pFStack_20->module_init == (FT_Module_Constructor)0x0) ||
               (memory._4_4_ = (*pFStack_20->module_init)(pFVar3), memory._4_4_ == 0)) {
              uVar1 = *(uint *)((long)&clazz_local->module_name + 4);
              *(uint *)((long)&clazz_local->module_name + 4) = uVar1 + 1;
              (&clazz_local->module_version)[uVar1] = (FT_Fixed)pFVar3;
              return memory._4_4_;
            }
          }
          if (((((pFVar3->clazz->module_flags & 2) != 0) &&
               (pFVar3[1].clazz != (FT_Module_Class *)0x0)) &&
              ((int)pFVar3[1].clazz[1].module_flags == 0x6f75746c)) &&
             (pFVar3[4].library != (FT_Library)0x0)) {
            (**(code **)((long)pFVar3[1].clazz[1].module_interface + 0x28))(pFVar3[4].library);
          }
          ft_mem_free(memory_00,pFVar3);
        }
      }
      else {
        memory._4_4_ = 0x30;
      }
      return memory._4_4_;
    }
    pFVar3 = (FT_Module)(&clazz_local->module_version)[driver._4_4_];
    iVar2 = strcmp(pFVar3->clazz->module_name,pFStack_20->module_name);
    if (iVar2 == 0) {
      if (pFStack_20->module_version <= pFVar3->clazz->module_version) {
        return 5;
      }
      FT_Remove_Module((FT_Library)clazz_local,pFVar3);
      goto LAB_00146c65;
    }
    driver._4_4_ = driver._4_4_ + 1;
  } while( true );
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Add_Module( FT_Library              library,
                 const FT_Module_Class*  clazz )
  {
    FT_Error   error;
    FT_Memory  memory;
    FT_Module  module = NULL;
    FT_UInt    nn;


#define FREETYPE_VER_FIXED  ( ( (FT_Long)FREETYPE_MAJOR << 16 ) | \
                                FREETYPE_MINOR                  )

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !clazz )
      return FT_THROW( Invalid_Argument );

    /* check FreeType version */
    if ( clazz->module_requires > FREETYPE_VER_FIXED )
      return FT_THROW( Invalid_Version );

    /* look for a module with the same name in the library's table */
    for ( nn = 0; nn < library->num_modules; nn++ )
    {
      module = library->modules[nn];
      if ( ft_strcmp( module->clazz->module_name, clazz->module_name ) == 0 )
      {
        /* this installed module has the same name, compare their versions */
        if ( clazz->module_version <= module->clazz->module_version )
          return FT_THROW( Lower_Module_Version );

        /* remove the module from our list, then exit the loop to replace */
        /* it by our new version..                                        */
        FT_Remove_Module( library, module );
        break;
      }
    }

    memory = library->memory;
    error  = FT_Err_Ok;

    if ( library->num_modules >= FT_MAX_MODULES )
    {
      error = FT_THROW( Too_Many_Drivers );
      goto Exit;
    }

    /* allocate module object */
    if ( FT_ALLOC( module, clazz->module_size ) )
      goto Exit;

    /* base initialization */
    module->library = library;
    module->memory  = memory;
    module->clazz   = (FT_Module_Class*)clazz;

    /* check whether the module is a renderer - this must be performed */
    /* before the normal module initialization                         */
    if ( FT_MODULE_IS_RENDERER( module ) )
    {
      /* add to the renderers list */
      error = ft_add_renderer( module );
      if ( error )
        goto Fail;
    }

    /* is the module a auto-hinter? */
    if ( FT_MODULE_IS_HINTER( module ) )
      library->auto_hinter = module;

    /* if the module is a font driver */
    if ( FT_MODULE_IS_DRIVER( module ) )
    {
      FT_Driver  driver = FT_DRIVER( module );


      driver->clazz = (FT_Driver_Class)module->clazz;
    }

    if ( clazz->module_init )
    {
      error = clazz->module_init( module );
      if ( error )
        goto Fail;
    }

    /* add module to the library's table */
    library->modules[library->num_modules++] = module;

  Exit:
    return error;

  Fail:
    if ( FT_MODULE_IS_RENDERER( module ) )
    {
      FT_Renderer  renderer = FT_RENDERER( module );


      if ( renderer->clazz                                          &&
           renderer->clazz->glyph_format == FT_GLYPH_FORMAT_OUTLINE &&
           renderer->raster                                         )
        renderer->clazz->raster_class->raster_done( renderer->raster );
    }

    FT_FREE( module );
    goto Exit;
  }